

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Flt_t *p;
  int iVar1;
  int iVar2;
  Nf_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  Scl_Con_t *pSVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  char *pTitle;
  float fVar7;
  
  pGVar5 = pGia;
  if (pGia->pSibls == (int *)0x0) {
    if (pPars->fCoarsen != 0) {
      pGVar5 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    }
  }
  else {
    pPars->fCoarsen = 0;
  }
  p_00 = Nf_StoCreate(pGVar5,pPars);
  if (p_00 == (Nf_Man_t *)0x0) {
    pGVar5 = (Gia_Man_t *)0x0;
  }
  else {
    if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
      printf("Initial ");
      Gia_ManPrintMuxStats(pGia);
      putchar(10);
      printf("Derived ");
      Gia_ManPrintMuxStats(pGVar5);
      putchar(10);
    }
    Nf_ManPrintInit(p_00);
    Nf_ManComputeCuts(p_00);
    Nf_ManPrintQuit(p_00);
    iVar1 = Scl_ConIsRunning();
    iVar6 = 0;
    if (iVar1 == 0) {
      for (; pGVar5 = p_00->pGia, iVar6 < pGVar5->vCis->nSize; iVar6 = iVar6 + 1) {
        pGVar3 = Gia_ManCi(pGVar5,iVar6);
        iVar1 = Gia_ObjId(pGVar5,pGVar3);
        if (iVar1 == 0) break;
        p = p_00->pGia->vInArrs;
        if (p == (Vec_Flt_t *)0x0) {
          iVar2 = 0;
        }
        else {
          fVar7 = Vec_FltEntry(p,iVar6);
          iVar2 = (int)(fVar7 * 1000.0);
        }
        Nf_ObjPrepareCi(p_00,iVar1,iVar2);
      }
    }
    else {
      for (; pGVar5 = p_00->pGia, iVar6 < pGVar5->vCis->nSize; iVar6 = iVar6 + 1) {
        pGVar3 = Gia_ManCi(pGVar5,iVar6);
        iVar1 = Gia_ObjId(pGVar5,pGVar3);
        if (iVar1 == 0) break;
        pSVar4 = Scl_ConReadMan();
        iVar2 = Vec_IntEntry(&pSVar4->vInArrs,iVar6);
        Nf_ObjPrepareCi(p_00,iVar1,iVar2);
      }
    }
    iVar1 = 0;
    while( true ) {
      p_00->Iter = iVar1;
      iVar6 = p_00->pPars->nRounds;
      if (iVar6 <= iVar1) break;
      Nf_ManComputeMapping(p_00);
      Nf_ManSetMapRefs(p_00);
      pTitle = "Area ";
      if (p_00->Iter == 0) {
        pTitle = "Delay";
      }
      Nf_ManPrintStats(p_00,pTitle);
      iVar1 = p_00->Iter + 1;
    }
    p_00->fUseEla = 1;
    while (iVar1 < iVar6 + pPars->nRoundsEla) {
      Nf_ManComputeMappingEla(p_00);
      Nf_ManUpdateStats(p_00);
      Nf_ManPrintStats(p_00,"Ela  ");
      iVar1 = p_00->Iter + 1;
      p_00->Iter = iVar1;
      iVar6 = p_00->pPars->nRounds;
    }
    Nf_ManFixPoDrivers(p_00);
    pGVar5 = Nf_ManDeriveMapping(p_00);
    Nf_StoDelete(p_00);
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
    if ( p == NULL )
        return NULL;
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
//            Nf_ObjPrepareCi( p, Id, Scl_Flt2Int(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
            Nf_ObjPrepareCi( p, Id, Scl_Flt2Int(p->pGia->vInArrs ? Vec_FltEntry(p->pGia->vInArrs, i) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    Nf_ManFixPoDrivers( p );
    pNew = Nf_ManDeriveMapping( p );
/*
    if ( pPars->fAreaOnly )
    {
        int Sbm_ManTestSat( void * pMan );
        Sbm_ManTestSat( p );
    }
*/
    Nf_StoDelete( p );
    return pNew;
}